

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglQuerySurfaceTests.cpp
# Opt level: O3

void __thiscall
deqp::egl::QuerySurfaceSimplePbufferCase::executeForConfig
          (QuerySurfaceSimplePbufferCase *this,EGLDisplay display,EGLConfig config)

{
  ostringstream *poVar1;
  TestLog *log;
  deUint32 err;
  EGLint EVar2;
  EGLint EVar3;
  int iVar4;
  uint uVar5;
  Library *egl;
  undefined4 extraout_var;
  int iVar6;
  UniqueSurface surface;
  EGLint attribs [7];
  UniqueSurface local_280;
  undefined1 local_268 [384];
  undefined4 local_e8;
  int local_e4;
  undefined4 local_e0;
  int local_dc;
  undefined8 local_d8;
  undefined4 local_d0;
  ConfigInfo local_c8;
  
  egl = EglTestContext::getLibrary
                  ((this->super_QuerySurfaceCase).super_SimpleConfigCase.super_TestCase.m_eglTestCtx
                  );
  log = ((this->super_QuerySurfaceCase).super_SimpleConfigCase.super_TestCase.super_TestCase.
         super_TestNode.m_testCtx)->m_log;
  local_c8.transparentRedValue = 0;
  local_c8.transparentGreenValue = 0;
  local_c8.transparentBlueValue = 0;
  local_c8.samples = 0;
  local_c8.stencilSize = 0;
  local_c8.surfaceType = 0;
  local_c8.transparentType = 0;
  local_c8.nativeVisualId = 0;
  local_c8.nativeVisualType = 0;
  local_c8.renderableType = 0;
  local_c8.sampleBuffers = 0;
  local_c8.maxPbufferHeight = 0;
  local_c8.maxSwapInterval = 0;
  local_c8.minSwapInterval = 0;
  local_c8.nativeRenderable = 0;
  local_c8.conformant = 0;
  local_c8.depthSize = 0;
  local_c8.level = 0;
  local_c8.maxPbufferWidth = 0;
  local_c8.bindToTextureRGBA = 0;
  local_c8.colorBufferType = 0;
  local_c8.configCaveat = 0;
  local_c8.configId = 0;
  local_c8.luminanceSize = 0;
  local_c8.alphaSize = 0;
  local_c8.alphaMaskSize = 0;
  local_c8.bindToTextureRGB = 0;
  local_c8.bufferSize = 0;
  local_c8.redSize = 0;
  local_c8.greenSize = 0;
  local_c8.blueSize = 0;
  local_c8.yuvOrder = 0x3038;
  local_c8.yuvNumberOfPlanes = 0;
  local_c8.yuvSubsample = 0x3038;
  local_c8.yuvDepthRange = 0x3038;
  local_c8.yuvCscStandard = 0x3038;
  local_c8.yuvPlaneBpp = 0x331b;
  local_c8.colorComponentType = 0x3038;
  eglu::queryCoreConfigInfo(egl,display,config,&local_c8);
  poVar1 = (ostringstream *)(local_268 + 8);
  local_268._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Creating pbuffer surface with config ID ",0x28);
  std::ostream::operator<<(poVar1,local_c8.configId);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_268,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_268 + 0x78));
  err = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(err,"before queries",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglQuerySurfaceTests.cpp"
                   ,0x178);
  EVar2 = eglu::getConfigAttribInt(egl,display,config,0x302c);
  iVar4 = 0x40;
  if (EVar2 < 0x40) {
    iVar4 = EVar2;
  }
  EVar3 = eglu::getConfigAttribInt(egl,display,config,0x302a);
  iVar6 = 0x40;
  if (EVar3 < 0x40) {
    iVar6 = EVar3;
  }
  if (EVar2 == 0 || EVar3 == 0) {
    poVar1 = (ostringstream *)(local_268 + 8);
    local_268._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"    Fail, maximum pbuffer size of ",0x22);
    std::ostream::operator<<(poVar1,iVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"x",1);
    std::ostream::operator<<(poVar1,iVar6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," reported",9);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_268,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_268 + 0x78));
    tcu::TestContext::setTestResult
              ((this->super_QuerySurfaceCase).super_SimpleConfigCase.super_TestCase.super_TestCase.
               super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"Invalid maximum pbuffer size");
  }
  else {
    local_e8 = 0x3057;
    local_e0 = 0x3056;
    local_d8 = 0x305c00003080;
    local_d0 = 0x3038;
    local_e4 = iVar4;
    local_dc = iVar6;
    iVar4 = (*egl->_vptr_Library[10])(egl,display,config);
    eglu::UniqueSurface::UniqueSurface
              (&local_280,egl,display,(EGLSurface)CONCAT44(extraout_var,iVar4));
    logSurfaceAttributes
              (log,egl,display,local_280.m_surface,
               (EGLint *)
               logCommonSurfaceAttributes(tcu::TestLog&,eglw::Library_const&,void*,void*)::
               attributes,0xb);
    logSurfaceAttributes
              (log,egl,display,local_280.m_surface,
               QuerySurfaceCase::checkNonPbufferAttributes::pbufferAttribs,5);
    QuerySurfaceCase::checkCommonAttributes
              (&this->super_QuerySurfaceCase,display,local_280.m_surface,&local_c8);
    uVar5 = eglu::querySurfaceInt(egl,display,local_280.m_surface,0x3058);
    if (1 < uVar5) {
      poVar1 = (ostringstream *)(local_268 + 8);
      local_268._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"    Fail, invalid largest pbuffer value ",0x28);
      std::ostream::operator<<(poVar1,uVar5);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_268,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base((ios_base *)(local_268 + 0x78));
      tcu::TestContext::setTestResult
                ((this->super_QuerySurfaceCase).super_SimpleConfigCase.super_TestCase.super_TestCase
                 .super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"Invalid largest pbuffer");
    }
    EVar2 = eglu::querySurfaceInt(egl,display,local_280.m_surface,0x3080);
    if (EVar2 - 0x305fU < 0xfffffffd) {
      poVar1 = (ostringstream *)(local_268 + 8);
      local_268._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"    Fail, invalid texture format value ",0x27);
      std::ostream::operator<<(poVar1,EVar2);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_268,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base((ios_base *)(local_268 + 0x78));
      tcu::TestContext::setTestResult
                ((this->super_QuerySurfaceCase).super_SimpleConfigCase.super_TestCase.super_TestCase
                 .super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"Invalid texture format");
    }
    EVar2 = eglu::querySurfaceInt(egl,display,local_280.m_surface,0x3081);
    if ((EVar2 != 0x305c) && (EVar2 != 0x305f)) {
      poVar1 = (ostringstream *)(local_268 + 8);
      local_268._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"    Fail, invalid texture target value ",0x27);
      std::ostream::operator<<(poVar1,EVar2);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_268,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base((ios_base *)(local_268 + 0x78));
      tcu::TestContext::setTestResult
                ((this->super_QuerySurfaceCase).super_SimpleConfigCase.super_TestCase.super_TestCase
                 .super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"Invalid texture target");
    }
    uVar5 = eglu::querySurfaceInt(egl,display,local_280.m_surface,0x3082);
    if (1 < uVar5) {
      poVar1 = (ostringstream *)(local_268 + 8);
      local_268._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"    Fail, invalid mipmap texture value ",0x27);
      std::ostream::operator<<(poVar1,uVar5);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_268,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base((ios_base *)(local_268 + 0x78));
      tcu::TestContext::setTestResult
                ((this->super_QuerySurfaceCase).super_SimpleConfigCase.super_TestCase.super_TestCase
                 .super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"Invalid mipmap texture");
    }
    eglu::UniqueSurface::~UniqueSurface(&local_280);
  }
  return;
}

Assistant:

void executeForConfig (EGLDisplay display, EGLConfig config)
	{
		const Library&	egl		= m_eglTestCtx.getLibrary();
		tcu::TestLog&	log		= m_testCtx.getLog();
		int				width	= 64;
		int				height	= 64;
		ConfigInfo		info;

		eglu::queryCoreConfigInfo(egl, display, config, &info);

		log << TestLog::Message << "Creating pbuffer surface with config ID " << info.configId << TestLog::EndMessage;
		EGLU_CHECK_MSG(egl, "before queries");

		// Clamp to maximums reported by implementation
		width	= deMin32(width, eglu::getConfigAttribInt(egl, display, config, EGL_MAX_PBUFFER_WIDTH));
		height	= deMin32(height, eglu::getConfigAttribInt(egl, display, config, EGL_MAX_PBUFFER_HEIGHT));

		if (width == 0 || height == 0)
		{
			log << TestLog::Message << "    Fail, maximum pbuffer size of " << width << "x" << height << " reported" << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid maximum pbuffer size");
			return;
		}

		const EGLint attribs[] =
		{
			EGL_WIDTH,			width,
			EGL_HEIGHT,			height,
			EGL_TEXTURE_FORMAT,	EGL_NO_TEXTURE,
			EGL_NONE
		};

		{
			eglu::UniqueSurface surface(egl, display, egl.createPbufferSurface(display, config, attribs));

			logCommonSurfaceAttributes	(log, egl, display, *surface);
			logPbufferSurfaceAttributes	(log, egl, display, *surface);
			checkCommonAttributes		(display, *surface, info);

			// Pbuffer-specific attributes

			// Largest pbuffer
			{
				const EGLint	largestPbuffer	= eglu::querySurfaceInt(egl, display, *surface, EGL_LARGEST_PBUFFER);

				if (largestPbuffer != EGL_FALSE && largestPbuffer != EGL_TRUE)
				{
					log << TestLog::Message << "    Fail, invalid largest pbuffer value " << largestPbuffer << TestLog::EndMessage;
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid largest pbuffer");
				}
			}

			// Texture format
			{
				const EGLint	textureFormat	= eglu::querySurfaceInt(egl, display, *surface, EGL_TEXTURE_FORMAT);

				if (textureFormat != EGL_NO_TEXTURE && textureFormat != EGL_TEXTURE_RGB && textureFormat != EGL_TEXTURE_RGBA)
				{
					log << TestLog::Message << "    Fail, invalid texture format value " << textureFormat << TestLog::EndMessage;
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid texture format");
				}
			}

			// Texture target
			{
				const EGLint	textureTarget	= eglu::querySurfaceInt(egl, display, *surface, EGL_TEXTURE_TARGET);

				if (textureTarget != EGL_NO_TEXTURE && textureTarget != EGL_TEXTURE_2D)
				{
					log << TestLog::Message << "    Fail, invalid texture target value " << textureTarget << TestLog::EndMessage;
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid texture target");
				}
			}

			// Mipmap texture
			{
				const EGLint	mipmapTexture	= eglu::querySurfaceInt(egl, display, *surface, EGL_MIPMAP_TEXTURE);

				if (mipmapTexture != EGL_FALSE && mipmapTexture != EGL_TRUE)
				{
					log << TestLog::Message << "    Fail, invalid mipmap texture value " << mipmapTexture << TestLog::EndMessage;
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid mipmap texture");
				}
			}
		}
	}